

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

Gia_Man_t * Cec_ManLSCorrespondence(Gia_Man_t *pAig,Cec_ParCor_t *pPars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  uint *pInitState_00;
  Vec_Ptr_t *pVVar11;
  void *pvVar12;
  int local_9c;
  int local_78;
  int local_5c;
  int i_1;
  char *pName_1;
  int i;
  char *pName;
  int RetValue;
  uint *pInitState;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Cec_ParCor_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  if (pAig->pReprs != (Gia_Rpr_t *)0x0) {
    free(pAig->pReprs);
    pAig->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (pAig->pNexts != (int *)0x0) {
    free(pAig->pNexts);
    pAig->pNexts = (int *)0x0;
  }
  if (pPars->nPrefix == 0) {
    iVar1 = Cec_ManLSCorrespondenceClasses(pAig,pPars);
    if (iVar1 == 0) {
      pGVar10 = Gia_ManDup(pAig);
      return pGVar10;
    }
  }
  else {
    pInitState_00 = Cec_ManComputeInitState(pAig,pPars->nPrefix);
    pGVar10 = Gia_ManDupFlip(pAig,(int *)pInitState_00);
    if (pInitState_00 != (uint *)0x0) {
      free(pInitState_00);
    }
    Cec_ManLSCorrespondenceClasses(pGVar10,pPars);
    pAig->pReprs = pGVar10->pReprs;
    pGVar10->pReprs = (Gia_Rpr_t *)0x0;
    pAig->pNexts = pGVar10->pNexts;
    pGVar10->pNexts = (int *)0x0;
    pPars->fUseCSat = 0;
    iVar1 = Abc_MaxInt(pPars->nBTLimit,1000);
    pPars->nBTLimit = iVar1;
    Cec_ManLSCorrespondenceBmc(pAig,pPars,pPars->nPrefix);
    Gia_ManStop(pGVar10);
  }
  if (pPars->fMakeChoices == 0) {
    pGVar10 = Gia_ManCorrReduce(pAig);
    pTemp = Gia_ManSeqCleanup(pGVar10);
    Gia_ManStop(pGVar10);
  }
  else {
    pTemp = Gia_ManEquivToChoices(pAig,1);
  }
  if (pPars->fVerbose != 0) {
    uVar2 = Gia_ManAndNum(pAig);
    uVar3 = Gia_ManAndNum(pTemp);
    iVar1 = Gia_ManAndNum(pAig);
    iVar4 = Gia_ManAndNum(pTemp);
    iVar5 = Gia_ManAndNum(pAig);
    if (iVar5 == 0) {
      local_78 = 1;
    }
    else {
      local_78 = Gia_ManAndNum(pAig);
    }
    uVar6 = Gia_ManRegNum(pAig);
    uVar7 = Gia_ManRegNum(pTemp);
    iVar5 = Gia_ManRegNum(pAig);
    iVar8 = Gia_ManRegNum(pTemp);
    iVar9 = Gia_ManRegNum(pAig);
    if (iVar9 == 0) {
      local_9c = 1;
    }
    else {
      local_9c = Gia_ManRegNum(pAig);
    }
    Abc_Print(1,
              "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n"
              ,((double)(iVar1 - iVar4) * 100.0) / (double)local_78,
              ((double)(iVar5 - iVar8) * 100.0) / (double)local_9c,(ulong)uVar2,(ulong)uVar3,
              (ulong)uVar6,(ulong)uVar7);
  }
  if (pPars->nPrefix != 0) {
    iVar1 = Gia_ManAndNum(pTemp);
    iVar4 = Gia_ManAndNum(pAig);
    if (iVar4 <= iVar1) {
      iVar1 = Gia_ManRegNum(pTemp);
      iVar4 = Gia_ManRegNum(pAig);
      if (iVar4 <= iVar1) goto LAB_007f3e26;
    }
    Abc_Print(1,"The reduced AIG was produced using %d-th invariants and will not verify.\n",
              (ulong)(uint)pPars->nPrefix);
  }
LAB_007f3e26:
  if (pPars->fVerboseFlops != 0) {
    if (pAig->vNamesIn == (Vec_Ptr_t *)0x0) {
      Abc_Print(1,"Flop output names are not available. Use command \"&get -n\".\n");
    }
    else {
      Cec_ManPrintFlopEquivs(pAig);
    }
  }
  if (pAig->vNamesIn != (Vec_Ptr_t *)0x0) {
    pVVar11 = Vec_PtrDupStr(pAig->vNamesIn);
    pTemp->vNamesIn = pVVar11;
    for (pName_1._4_4_ = Gia_ManCiNum(pTemp); iVar1 = Vec_PtrSize(pTemp->vNamesIn),
        pName_1._4_4_ < iVar1; pName_1._4_4_ = pName_1._4_4_ + 1) {
      pvVar12 = Vec_PtrEntry(pTemp->vNamesIn,pName_1._4_4_);
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
      }
    }
    pVVar11 = pTemp->vNamesIn;
    iVar1 = Gia_ManCiNum(pTemp);
    Vec_PtrShrink(pVVar11,iVar1);
  }
  if (pAig->vNamesOut != (Vec_Ptr_t *)0x0) {
    pVVar11 = Vec_PtrDupStr(pAig->vNamesOut);
    pTemp->vNamesOut = pVVar11;
    for (local_5c = Gia_ManCoNum(pTemp); iVar1 = Vec_PtrSize(pTemp->vNamesOut), local_5c < iVar1;
        local_5c = local_5c + 1) {
      pvVar12 = Vec_PtrEntry(pTemp->vNamesOut,local_5c);
      if (pvVar12 != (void *)0x0) {
        free(pvVar12);
      }
    }
    pVVar11 = pTemp->vNamesOut;
    iVar1 = Gia_ManCoNum(pTemp);
    Vec_PtrShrink(pVVar11,iVar1);
  }
  return pTemp;
}

Assistant:

Gia_Man_t * Cec_ManLSCorrespondence( Gia_Man_t * pAig, Cec_ParCor_t * pPars )
{  
    Gia_Man_t * pNew, * pTemp;
    unsigned * pInitState;
    int RetValue;
    ABC_FREE( pAig->pReprs );
    ABC_FREE( pAig->pNexts );
    if ( pPars->nPrefix == 0 )
    {
        RetValue = Cec_ManLSCorrespondenceClasses( pAig, pPars );
        if ( RetValue == 0 )
            return Gia_ManDup( pAig );
    }
    else
    {
        // compute the cycles AIG
        pInitState = Cec_ManComputeInitState( pAig, pPars->nPrefix );
        pTemp = Gia_ManDupFlip( pAig, (int *)pInitState );
        ABC_FREE( pInitState );
        // compute classes of this AIG
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
        // perform additional BMC
        pPars->fUseCSat = 0;
        pPars->nBTLimit = Abc_MaxInt( pPars->nBTLimit, 1000 );
        Cec_ManLSCorrespondenceBmc( pAig, pPars, pPars->nPrefix );
/*
        // transfer the class info back
        pTemp->pReprs = pAig->pReprs; pAig->pReprs = NULL;
        pTemp->pNexts = pAig->pNexts; pAig->pNexts = NULL;
        // continue refining
        RetValue = Cec_ManLSCorrespondenceClasses( pTemp, pPars );
        // transfer the class info
        pAig->pReprs = pTemp->pReprs; pTemp->pReprs = NULL;
        pAig->pNexts = pTemp->pNexts; pTemp->pNexts = NULL;
*/
        Gia_ManStop( pTemp );
    }
    // derive reduced AIG
    if ( pPars->fMakeChoices )
    {
        pNew = Gia_ManEquivToChoices( pAig, 1 );
//        Gia_ManHasChoices_very_old( pNew );
    }
    else
    {
//        Gia_ManEquivImprove( pAig );
        pNew = Gia_ManCorrReduce( pAig );
        pNew = Gia_ManSeqCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
        //Gia_AigerWrite( pNew, "reduced.aig", 0, 0, 0 );
    }
    // report the results
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "NBeg = %d. NEnd = %d. (Gain = %6.2f %%).  RBeg = %d. REnd = %d. (Gain = %6.2f %%).\n", 
            Gia_ManAndNum(pAig), Gia_ManAndNum(pNew), 
            100.0*(Gia_ManAndNum(pAig)-Gia_ManAndNum(pNew))/(Gia_ManAndNum(pAig)?Gia_ManAndNum(pAig):1), 
            Gia_ManRegNum(pAig), Gia_ManRegNum(pNew), 
            100.0*(Gia_ManRegNum(pAig)-Gia_ManRegNum(pNew))/(Gia_ManRegNum(pAig)?Gia_ManRegNum(pAig):1) );
    }
    if ( pPars->nPrefix && (Gia_ManAndNum(pNew) < Gia_ManAndNum(pAig) || Gia_ManRegNum(pNew) < Gia_ManRegNum(pAig)) )
        Abc_Print( 1, "The reduced AIG was produced using %d-th invariants and will not verify.\n", pPars->nPrefix );
    // print verbose info about equivalences
    if ( pPars->fVerboseFlops )
    {
        if ( pAig->vNamesIn == NULL )
            Abc_Print( 1, "Flop output names are not available. Use command \"&get -n\".\n" );
        else
            Cec_ManPrintFlopEquivs( pAig );
    }
    // copy names if present
    if ( pAig->vNamesIn )
    {
        char * pName; int i;
        pNew->vNamesIn = Vec_PtrDupStr( pAig->vNamesIn );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesIn, pName, i, Gia_ManCiNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesIn, Gia_ManCiNum(pNew) );
    }
    if ( pAig->vNamesOut )
    {
        char * pName; int i;
        pNew->vNamesOut = Vec_PtrDupStr( pAig->vNamesOut );
        Vec_PtrForEachEntryStart( char *, pNew->vNamesOut, pName, i, Gia_ManCoNum(pNew) )
            ABC_FREE( pName );
        Vec_PtrShrink( pNew->vNamesOut, Gia_ManCoNum(pNew) );
    }
    return pNew;
}